

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O0

void __thiscall
pbrt::RGBUnboundedSpectrum::RGBUnboundedSpectrum
          (RGBUnboundedSpectrum *this,RGBColorSpace *cs,RGB rgb)

{
  undefined8 uVar1;
  initializer_list<float> __l;
  undefined8 in_RSI;
  float *in_RDI;
  float fVar2;
  undefined1 in_ZMM0 [64];
  undefined1 auVar5 [56];
  undefined1 auVar4 [64];
  RGB RVar6;
  RGBSigmoidPolynomial RVar7;
  Float m;
  iterator in_stack_ffffffffffffff48;
  RGB *in_stack_ffffffffffffff60;
  RGB local_6c [2];
  Float local_54;
  undefined4 local_50;
  Float *local_48;
  RGBColorSpace *this_00;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffffe0;
  Float FVar9;
  undefined4 uStack_8;
  undefined1 auVar3 [64];
  
  uVar1 = vmovlpd_avx(in_ZMM0._0_16_);
  local_54 = (Float)uVar1;
  uVar8 = (undefined4)((ulong)in_RDI >> 0x20);
  *in_RDI = 1.0;
  uStack_8 = (undefined4)((ulong)uVar1 >> 0x20);
  local_50 = uStack_8;
  local_48 = &local_54;
  this_00 = (RGBColorSpace *)0x3;
  __l._M_len = (size_type)in_RDI;
  __l._M_array = in_stack_ffffffffffffff48;
  FVar9 = local_54;
  fVar2 = std::max<float>(__l);
  *in_RDI = fVar2 * 2.0;
  if ((*in_RDI != 0.0) || (NAN(*in_RDI))) {
    auVar5 = (undefined1  [56])0x0;
    RVar6 = RGB::operator/(in_stack_ffffffffffffff60,(Float)((ulong)in_RSI >> 0x20));
    local_6c[0].b = RVar6.b;
    auVar3._0_8_ = RVar6._0_8_;
    auVar3._8_56_ = auVar5;
    local_6c[0]._0_8_ = vmovlpd_avx(auVar3._0_16_);
  }
  else {
    RGB::RGB(local_6c,0.0,0.0,0.0);
  }
  auVar5 = ZEXT856(0);
  RVar6.g = (Float)in_stack_ffffffffffffffe0;
  RVar6.r = (Float)uVar8;
  RVar6.b = FVar9;
  RVar7 = RGBColorSpace::ToRGBCoeffs(this_00,RVar6);
  auVar4._0_8_ = RVar7._0_8_;
  auVar4._8_56_ = auVar5;
  uVar1 = vmovlpd_avx(auVar4._0_16_);
  *(undefined8 *)(in_RDI + 1) = uVar1;
  in_RDI[3] = RVar7.c2;
  return;
}

Assistant:

PBRT_CPU_GPU RGBUnboundedSpectrum::RGBUnboundedSpectrum(const RGBColorSpace &cs, RGB rgb) {
    Float m = std::max({rgb.r, rgb.g, rgb.b});
    scale = 2 * m;
    rsp = cs.ToRGBCoeffs(scale ? rgb / scale : RGB(0, 0, 0));
}